

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

LY_ERR lyb_parse_node_leaf(lyd_lyb_ctx *lybctx,lyd_node *parent,lysc_node *snode,lyd_node **first_p,
                          ly_set *parsed)

{
  lylyb_ctx *lybctx_00;
  lyd_node **first_p_00;
  LY_ERR LVar1;
  lysc_node *plVar2;
  uint8_t *buf;
  ulong count;
  ly_bool dynamic;
  lyd_node *node;
  uint32_t flags;
  lyd_meta *meta;
  lyd_node *local_50;
  ly_set *local_48;
  lyd_node **local_40;
  ulong local_38;
  
  node = (lyd_node *)0x0;
  meta = (lyd_meta *)0x0;
  LVar1 = lyb_parse_node_header(lybctx,snode,&flags,&meta);
  if (LVar1 == LY_SUCCESS) {
    lybctx_00 = lybctx->lybctx;
    if (lybctx_00 == (lylyb_ctx *)0x0) {
      __assert_fail("term && term_value && term_value_len && lybctx",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                    ,0x108,
                    "LY_ERR lyb_read_term_value(const struct lysc_node_leaf *, uint8_t **, uint64_t *, struct lylyb_ctx *)"
                   );
    }
    plVar2 = snode[1].parent;
    if (*(int *)&plVar2->next == 0xe) {
      plVar2 = (lysc_node *)plVar2->dsc;
    }
    count = (ulong)*(int *)&plVar2->parent->exts;
    local_50 = parent;
    local_48 = parsed;
    if ((long)count < 0) {
      lyb_read_number(&local_38,8,8,lybctx_00);
      count = local_38;
    }
    buf = (uint8_t *)malloc((ulong)((int)count + 1));
    if (buf == (uint8_t *)0x0) {
      LVar1 = LY_EMEM;
      ly_log(lybctx_00->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyb_read_term_value");
    }
    else {
      local_40 = first_p;
      if (count != 0) {
        lyb_read(buf,count,lybctx_00);
      }
      buf[count & 0xffffffff] = '\0';
      dynamic = '\x01';
      LVar1 = lyd_parser_create_term
                        ((lyd_ctx *)lybctx,snode,buf,count,&dynamic,LY_VALUE_LYB,(void *)0x0,0x3f3,
                         &node);
      if (dynamic != '\0') {
        free(buf);
      }
      first_p_00 = local_40;
      if (LVar1 == LY_SUCCESS) {
        if (node != (lyd_node *)0x0) {
          ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
          lyb_finish_node(lybctx,local_50,flags,&meta,&node,first_p_00,local_48);
          ly_log_location_revert(0,1,0,0);
          return LY_SUCCESS;
        }
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                      ,0x559,
                      "LY_ERR lyb_parse_node_leaf(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                     );
      }
      lyd_free_tree(node);
      node = (lyd_node *)0x0;
    }
  }
  lyd_free_meta_siblings(meta);
  lyd_free_tree(node);
  return LVar1;
}

Assistant:

static LY_ERR
lyb_parse_node_leaf(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, const struct lysc_node *snode,
        struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR ret;
    struct lyd_node *node = NULL;
    struct lyd_meta *meta = NULL;
    uint32_t flags;

    /* read necessary basic data */
    ret = lyb_parse_node_header(lybctx, snode, &flags, &meta);
    LY_CHECK_GOTO(ret, error);

    /* read value of term node and create it */
    ret = lyb_create_term(lybctx, snode, &node);
    LY_CHECK_GOTO(ret, error);

    assert(node);
    LOG_LOCSET(NULL, node);

    lyb_finish_node(lybctx, parent, flags, &meta, &node, first_p, parsed);

    LOG_LOCBACK(0, 1);
    return LY_SUCCESS;

error:
    lyd_free_meta_siblings(meta);
    lyd_free_tree(node);
    return ret;
}